

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

string * __thiscall version_struct::to_string_abi_cxx11_(version_struct *this)

{
  uint *in_RSI;
  string *in_RDI;
  char v_str [128];
  string *s;
  allocator local_9a;
  undefined1 local_99;
  char local_98 [152];
  
  snprintf(local_98,0x80,"%d.%d.%d",(ulong)*in_RSI,(ulong)in_RSI[1],(ulong)in_RSI[2]);
  local_99 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_98,&local_9a);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a);
  return in_RDI;
}

Assistant:

std::string to_string() const
  {
    char v_str[128];
    sprintf_s(v_str, sizeof(v_str), "%d.%d.%d", major, minor, rev);
    std::string s = v_str;
    return s;
  }